

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  Colour colourGuard;
  string local_98;
  Text local_78;
  TextAttributes local_28;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    colourGuard.m_moved = false;
    Colour::use(ReconstructedExpression);
    poVar2 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_98,this->result);
    local_28.initialIndent = 0xffffffffffffffff;
    local_28.width = 0x4f;
    local_28.indent = 2;
    Tbc::Text::Text(&local_78,&local_98,&local_28);
    poVar2 = Tbc::operator<<(poVar2,&local_78);
    std::operator<<(poVar2,'\n');
    Tbc::Text::~Text(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    Colour::~Colour(&colourGuard);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << '\n';
                }
            }